

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::reserve
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,size_t n)

{
  memory_resource *pmVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar6;
  size_t sVar7;
  int *piVar5;
  
  uVar4 = 4;
  if (this->ptr != (int *)0x0) {
    uVar4 = this->nAlloc;
  }
  if (uVar4 < n) {
    if (n * 4 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 4,4);
      piVar5 = (int *)CONCAT44(extraout_var,iVar3);
    }
    sVar2 = this->nStored;
    if (sVar2 != 0) {
      paVar6 = &this->field_2;
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
           *)this->ptr !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
           *)0x0) {
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)this->ptr;
      }
      sVar7 = 0;
      do {
        piVar5[sVar7] = paVar6->fixed[sVar7];
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
    if (this->ptr != (int *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 2,4);
    }
    this->nAlloc = n;
    this->ptr = piVar5;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }